

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::csharp::MessageGenerator::Generate
          (MessageGenerator *this,Printer *printer)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  csharp *pcVar3;
  string *value1;
  bool bVar4;
  mapped_type *pmVar5;
  long *plVar6;
  undefined8 *puVar7;
  FieldGeneratorBase *pFVar8;
  Descriptor *pDVar9;
  Options *pOVar10;
  ulong *puVar11;
  _func_int **pp_Var12;
  int i;
  int i_00;
  FileDescriptor *descriptor;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *pFVar13;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  Printer *pPVar18;
  long lVar19;
  key_type local_160;
  Printer *local_140;
  EnumGenerator enumGenerator;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  string local_c8;
  long local_a8;
  key_type local_a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  string local_50;
  
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
  lVar14 = **(long **)this->descriptor_;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&enumGenerator,lVar14,(*(long **)this->descriptor_)[1] + lVar14);
  paVar2 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"class_name","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_160);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.super_SourceGeneratorBase.options_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                   file_extension)._M_dataplus._M_p + 1));
  }
  SourceGeneratorBase::class_access_level_abi_cxx11_
            ((string *)&enumGenerator,&this->super_SourceGeneratorBase);
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"access_level","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_160);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.super_SourceGeneratorBase.options_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                   file_extension)._M_dataplus._M_p + 1));
  }
  WriteMessageDocComment(printer,this->descriptor_);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x6a) == '\x01') {
    io::Printer::Print(printer,"[global::System.ObsoleteAttribute]\n");
  }
  io::Printer::Print(printer,&vars,
                     "$access_level$ sealed partial class $class_name$ : pb::IMessage<$class_name$> {\n"
                    );
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n"
                    );
  pcVar3 = *(csharp **)(this->descriptor_ + 0x18);
  if (pcVar3 == (csharp *)0x0) {
    GetReflectionClassName_abi_cxx11_(&local_50,*(csharp **)(this->descriptor_ + 0x10),descriptor);
    puVar7 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    puVar11 = puVar7 + 2;
    if ((ulong *)*puVar7 == puVar11) {
      local_d8 = *puVar11;
      lStack_d0 = puVar7[3];
      local_e8 = &local_d8;
    }
    else {
      local_d8 = *puVar11;
      local_e8 = (ulong *)*puVar7;
    }
    local_e0 = puVar7[1];
    *puVar7 = puVar11;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    pDVar9 = this->descriptor_;
    lVar14 = *(long *)(pDVar9 + 0x18);
    plVar6 = (long *)(*(long *)(pDVar9 + 0x10) + 0x60);
    if (lVar14 != 0) {
      plVar6 = (long *)(lVar14 + 0x50);
    }
    SimpleItoa_abi_cxx11_
              (&local_c8,
               (protobuf *)(ulong)(uint)((int)((ulong)((long)pDVar9 - *plVar6) >> 3) * 0x3cf3cf3d),
               (int)lVar14);
    uVar15 = 0xf;
    if (local_e8 != &local_d8) {
      uVar15 = local_d8;
    }
    if (uVar15 < local_c8._M_string_length + local_e0) {
      uVar16 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        uVar16 = local_c8.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar16 < local_c8._M_string_length + local_e0) goto LAB_00267071;
      puVar7 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
    }
    else {
LAB_00267071:
      puVar7 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
    }
    psVar1 = puVar7 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar1) {
      local_160.field_2._M_allocated_capacity = *psVar1;
      local_160.field_2._8_8_ = puVar7[3];
      local_160._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_160.field_2._M_allocated_capacity = *psVar1;
      local_160._M_dataplus._M_p = (pointer)*puVar7;
    }
    local_160._M_string_length = puVar7[1];
    *puVar7 = psVar1;
    puVar7[1] = 0;
    *(undefined1 *)psVar1 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
         (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
    pp_Var12 = (_func_int **)(plVar6 + 2);
    if ((_func_int **)*plVar6 == pp_Var12) {
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var12;
      enumGenerator.descriptor_._0_4_ = (undefined4)plVar6[3];
      enumGenerator.descriptor_._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
    }
    else {
      enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var12;
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)*plVar6;
    }
    enumGenerator.super_SourceGeneratorBase.descriptor_ = (FileDescriptor *)plVar6[1];
    *plVar6 = (long)pp_Var12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"descriptor_accessor","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,&local_a0);
    goto LAB_0026716c;
  }
  GetClassName_abi_cxx11_(&local_50,pcVar3,(Descriptor *)descriptor);
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar11 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar11) {
    local_d8 = *puVar11;
    lStack_d0 = plVar6[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar11;
    local_e8 = (ulong *)*plVar6;
  }
  local_e0 = plVar6[1];
  *plVar6 = (long)puVar11;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  pDVar9 = this->descriptor_;
  lVar14 = *(long *)(pDVar9 + 0x18);
  plVar6 = (long *)(*(long *)(pDVar9 + 0x10) + 0x60);
  if (lVar14 != 0) {
    plVar6 = (long *)(lVar14 + 0x50);
  }
  SimpleItoa_abi_cxx11_
            (&local_c8,
             (protobuf *)(ulong)(uint)((int)((ulong)((long)pDVar9 - *plVar6) >> 3) * 0x3cf3cf3d),
             (int)lVar14);
  uVar15 = 0xf;
  if (local_e8 != &local_d8) {
    uVar15 = local_d8;
  }
  if (uVar15 < local_c8._M_string_length + local_e0) {
    uVar16 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar16 = local_c8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar16 < local_c8._M_string_length + local_e0) goto LAB_00266ebf;
    puVar7 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
  }
  else {
LAB_00266ebf:
    puVar7 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
  }
  psVar1 = puVar7 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar7 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_160.field_2._M_allocated_capacity = *psVar1;
    local_160.field_2._8_8_ = puVar7[3];
    local_160._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_160.field_2._M_allocated_capacity = *psVar1;
    local_160._M_dataplus._M_p = (pointer)*puVar7;
  }
  local_160._M_string_length = puVar7[1];
  *puVar7 = psVar1;
  puVar7[1] = 0;
  *(undefined1 *)psVar1 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_160);
  enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
       (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
  pp_Var12 = (_func_int **)(plVar6 + 2);
  if ((_func_int **)*plVar6 == pp_Var12) {
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var12;
    enumGenerator.descriptor_._0_4_ = (undefined4)plVar6[3];
    enumGenerator.descriptor_._4_4_ = *(undefined4 *)((long)plVar6 + 0x1c);
  }
  else {
    enumGenerator.super_SourceGeneratorBase.options_ = (Options *)*pp_Var12;
    enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase = (_func_int **)*plVar6;
  }
  enumGenerator.super_SourceGeneratorBase.descriptor_ = (FileDescriptor *)plVar6[1];
  *plVar6 = (long)pp_Var12;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"descriptor_accessor","");
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,&local_a0);
LAB_0026716c:
  std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
      &enumGenerator.super_SourceGeneratorBase.options_) {
    operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                    (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                   file_extension)._M_dataplus._M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8,local_d8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public static pbr::MessageDescriptor Descriptor {\n  get { return $descriptor_accessor$; }\n}\n\n"
                    );
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "pbr::MessageDescriptor pb::IMessage.Descriptor {\n  get { return Descriptor; }\n}\n\n"
                    );
  bVar4 = IsDescriptorOptionMessage(this->descriptor_);
  if (bVar4) {
    io::Printer::Print(printer,
                       "internal CustomOptions CustomOptions{ get; private set; } = CustomOptions.Empty;\n\n"
                      );
  }
  SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,printer);
  io::Printer::Print(printer,&vars,
                     "public $class_name$() {\n  OnConstruction();\n}\n\npartial void OnConstruction();\n\n"
                    );
  GenerateCloningCode(this,printer);
  pDVar9 = this->descriptor_;
  local_140 = printer;
  if (0 < *(int *)(pDVar9 + 0x2c)) {
    lVar19 = 0;
    lVar14 = 0;
    pFVar13 = extraout_RDX;
    do {
      lVar17 = *(long *)(pDVar9 + 0x30);
      value1 = *(string **)(lVar17 + lVar19);
      local_a8 = lVar14;
      GetFieldConstantName_abi_cxx11_((string *)&enumGenerator,(csharp *)(lVar17 + lVar19),pFVar13);
      SimpleItoa_abi_cxx11_(&local_160,(protobuf *)(ulong)*(uint *)(lVar17 + 0x38 + lVar19),i);
      io::Printer::Print(local_140,
                         "/// <summary>Field number for the \"$field_name$\" field.</summary>\npublic const int $field_constant_name$ = $index$;\n"
                         ,"field_name",value1,"field_constant_name",(string *)&enumGenerator,"index"
                         ,&local_160);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      pFVar8 = CreateFieldGeneratorInternal(this,(FieldDescriptor *)(lVar17 + lVar19));
      pPVar18 = local_140;
      if (pFVar8 == (FieldGeneratorBase *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                      ,0x5f,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::compiler::csharp::FieldGeneratorBase>::operator->() const [C = google::protobuf::compiler::csharp::FieldGeneratorBase]"
                     );
      }
      (*(pFVar8->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[5])(pFVar8,local_140);
      lVar14 = local_a8;
      io::Printer::Print(pPVar18,"\n");
      (*(pFVar8->super_SourceGeneratorBase)._vptr_SourceGeneratorBase[1])(pFVar8);
      lVar14 = lVar14 + 1;
      pDVar9 = this->descriptor_;
      lVar19 = lVar19 + 0xa8;
      pFVar13 = extraout_RDX_00;
    } while (lVar14 < *(int *)(pDVar9 + 0x2c));
  }
  pPVar18 = local_140;
  if (0 < *(int *)(pDVar9 + 0x38)) {
    lVar14 = 0;
    do {
      lVar19 = lVar14 * 0x30;
      local_a8 = lVar14;
      UnderscoresToCamelCase
                ((string *)&enumGenerator,*(string **)(*(long *)(pDVar9 + 0x40) + lVar19),false,
                 false);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_160);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      UnderscoresToCamelCase
                ((string *)&enumGenerator,*(string **)(*(long *)(this->descriptor_ + 0x40) + lVar19)
                 ,true,false);
      local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"property_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_160);
      std::__cxx11::string::operator=((string *)pmVar5,(string *)&enumGenerator);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._M_dataplus._M_p != &local_160.field_2) {
        operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
      }
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase =
           (_func_int **)&enumGenerator.super_SourceGeneratorBase.options_;
      std::__cxx11::string::_M_construct<char_const*>((string *)&enumGenerator,"original_name","");
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(string *)&enumGenerator);
      std::__cxx11::string::_M_assign((string *)pmVar5);
      if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
          &enumGenerator.super_SourceGeneratorBase.options_) {
        operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                        (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                       file_extension)._M_dataplus._M_p + 1));
      }
      io::Printer::Print(pPVar18,&vars,
                         "private object $name$_;\n/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\npublic enum $property_name$OneofCase {\n"
                        );
      io::Printer::Indent(pPVar18);
      io::Printer::Print(pPVar18,"None = 0,\n");
      lVar14 = *(long *)(this->descriptor_ + 0x40);
      if (0 < *(int *)(lVar14 + 0x1c + lVar19)) {
        lVar17 = 0;
        pFVar13 = extraout_RDX_01;
        do {
          pcVar3 = *(csharp **)(*(long *)(lVar14 + 0x20 + lVar19) + lVar17 * 8);
          GetPropertyName_abi_cxx11_((string *)&enumGenerator,pcVar3,pFVar13);
          SimpleItoa_abi_cxx11_(&local_160,(protobuf *)(ulong)*(uint *)(pcVar3 + 0x38),i_00);
          io::Printer::Print(local_140,"$field_property_name$ = $index$,\n","field_property_name",
                             (string *)&enumGenerator,"index",&local_160);
          pFVar13 = extraout_RDX_02;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_160._M_dataplus._M_p != &local_160.field_2) {
            operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
            pFVar13 = extraout_RDX_03;
          }
          if ((Options **)enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase !=
              &enumGenerator.super_SourceGeneratorBase.options_) {
            operator_delete(enumGenerator.super_SourceGeneratorBase._vptr_SourceGeneratorBase,
                            (ulong)((long)&((enumGenerator.super_SourceGeneratorBase.options_)->
                                           file_extension)._M_dataplus._M_p + 1));
            pFVar13 = extraout_RDX_04;
          }
          lVar17 = lVar17 + 1;
          lVar14 = *(long *)(this->descriptor_ + 0x40);
        } while (lVar17 < *(int *)(lVar14 + 0x1c + lVar19));
      }
      pPVar18 = local_140;
      io::Printer::Outdent(local_140);
      io::Printer::Print(pPVar18,"}\n");
      io::Printer::Print(pPVar18,&vars,
                         "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n"
                        );
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar18);
      io::Printer::Print(pPVar18,&vars,
                         "public $property_name$OneofCase $property_name$Case {\n  get { return $name$Case_; }\n}\n\n"
                        );
      SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar18);
      io::Printer::Print(pPVar18,&vars,
                         "public void Clear$property_name$() {\n  $name$Case_ = $property_name$OneofCase.None;\n  $name$_ = null;\n}\n\n"
                        );
      lVar14 = local_a8 + 1;
      pDVar9 = this->descriptor_;
    } while (lVar14 < *(int *)(pDVar9 + 0x38));
  }
  GenerateFrameworkMethods(this,pPVar18);
  GenerateMessageSerializationMethods(this,pPVar18);
  GenerateMergingMethods(this,pPVar18);
  pDVar9 = this->descriptor_;
  if (*(int *)(pDVar9 + 0x58) < 1) {
    if (0 < (long)*(int *)(pDVar9 + 0x48)) {
      lVar14 = 0;
      do {
        if (*(char *)(*(long *)(*(long *)(pDVar9 + 0x50) + 0x20 + lVar14) + 0x6b) == '\0')
        goto LAB_0026771a;
        lVar14 = lVar14 + 0xa8;
      } while ((long)*(int *)(pDVar9 + 0x48) * 0xa8 - lVar14 != 0);
    }
  }
  else {
LAB_0026771a:
    io::Printer::Print(pPVar18,&vars,
                       "#region Nested types\n/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n"
                      );
    SourceGeneratorBase::WriteGeneratedCodeAttributes(&this->super_SourceGeneratorBase,pPVar18);
    io::Printer::Print(pPVar18,"public static partial class Types {\n");
    io::Printer::Indent(pPVar18);
    pDVar9 = this->descriptor_;
    if (0 < *(int *)(pDVar9 + 0x58)) {
      lVar19 = 0;
      lVar14 = 0;
      do {
        lVar17 = *(long *)(pDVar9 + 0x60);
        pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
        EnumGenerator::EnumGenerator(&enumGenerator,(EnumDescriptor *)(lVar17 + lVar19),pOVar10);
        EnumGenerator::Generate(&enumGenerator,local_140);
        EnumGenerator::~EnumGenerator(&enumGenerator);
        lVar14 = lVar14 + 1;
        pDVar9 = this->descriptor_;
        lVar19 = lVar19 + 0x38;
      } while (lVar14 < *(int *)(pDVar9 + 0x58));
    }
    if (0 < *(int *)(pDVar9 + 0x48)) {
      lVar19 = 0;
      lVar14 = 0;
      do {
        lVar17 = *(long *)(pDVar9 + 0x50);
        if (*(char *)(*(long *)(lVar17 + 0x20 + lVar19) + 0x6b) == '\0') {
          pOVar10 = SourceGeneratorBase::options(&this->super_SourceGeneratorBase);
          MessageGenerator((MessageGenerator *)&enumGenerator,(Descriptor *)(lVar17 + lVar19),
                           pOVar10);
          Generate((MessageGenerator *)&enumGenerator,local_140);
          ~MessageGenerator((MessageGenerator *)&enumGenerator);
          pDVar9 = this->descriptor_;
        }
        lVar14 = lVar14 + 1;
        lVar19 = lVar19 + 0xa8;
      } while (lVar14 < *(int *)(pDVar9 + 0x48));
    }
    pPVar18 = local_140;
    io::Printer::Outdent(local_140);
    io::Printer::Print(pPVar18,"}\n#endregion\n\n");
  }
  io::Printer::Outdent(pPVar18);
  io::Printer::Print(pPVar18,"}\n");
  io::Printer::Print(pPVar18,"\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageGenerator::Generate(io::Printer* printer) {
  map<string, string> vars;
  vars["class_name"] = class_name();
  vars["access_level"] = class_access_level();

  WriteMessageDocComment(printer, descriptor_);
  AddDeprecatedFlag(printer);
  
  printer->Print(
    vars,
    "$access_level$ sealed partial class $class_name$ : pb::IMessage<$class_name$> {\n");
  printer->Indent();

  // All static fields and properties
  printer->Print(
	  vars,
	  "private static readonly pb::MessageParser<$class_name$> _parser = new pb::MessageParser<$class_name$>(() => new $class_name$());\n");

  WriteGeneratedCodeAttributes(printer);

  printer->Print(
	  vars,
	  "public static pb::MessageParser<$class_name$> Parser { get { return _parser; } }\n\n");

  // Access the message descriptor via the relevant file descriptor or containing message descriptor.
  if (!descriptor_->containing_type()) {
    vars["descriptor_accessor"] = GetReflectionClassName(descriptor_->file())
        + ".Descriptor.MessageTypes[" + SimpleItoa(descriptor_->index()) + "]";
  } else {
    vars["descriptor_accessor"] = GetClassName(descriptor_->containing_type())
        + ".Descriptor.NestedTypes[" + SimpleItoa(descriptor_->index()) + "]";
  }

  WriteGeneratedCodeAttributes(printer);
  printer->Print(
	vars,
	"public static pbr::MessageDescriptor Descriptor {\n"
	"  get { return $descriptor_accessor$; }\n"
	"}\n"
	"\n");
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
	vars,
    "pbr::MessageDescriptor pb::IMessage.Descriptor {\n"
    "  get { return Descriptor; }\n"
    "}\n"
    "\n");
  // CustomOptions property, only for options messages
  if (IsDescriptorOptionMessage(descriptor_)) {
    printer->Print(
      "internal CustomOptions CustomOptions{ get; private set; } = CustomOptions.Empty;\n"
       "\n");
  }

  // Parameterless constructor and partial OnConstruction method.
  WriteGeneratedCodeAttributes(printer);
  printer->Print(
    vars,
    "public $class_name$() {\n"
    "  OnConstruction();\n"
    "}\n\n"
    "partial void OnConstruction();\n\n");

  GenerateCloningCode(printer);
  GenerateFreezingCode(printer);

  // Fields/properties
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* fieldDescriptor = descriptor_->field(i);

    // Rats: we lose the debug comment here :(
    printer->Print(
      "/// <summary>Field number for the \"$field_name$\" field.</summary>\n"
      "public const int $field_constant_name$ = $index$;\n",
      "field_name", fieldDescriptor->name(),
      "field_constant_name", GetFieldConstantName(fieldDescriptor),
      "index", SimpleItoa(fieldDescriptor->number()));
    scoped_ptr<FieldGeneratorBase> generator(
        CreateFieldGeneratorInternal(fieldDescriptor));
    generator->GenerateMembers(printer);
    printer->Print("\n");
  }

  // oneof properties
  for (int i = 0; i < descriptor_->oneof_decl_count(); i++) {
    vars["name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), false);
    vars["property_name"] = UnderscoresToCamelCase(descriptor_->oneof_decl(i)->name(), true);
    vars["original_name"] = descriptor_->oneof_decl(i)->name();
    printer->Print(
      vars,
      "private object $name$_;\n"
      "/// <summary>Enum of possible cases for the \"$original_name$\" oneof.</summary>\n"
      "public enum $property_name$OneofCase {\n");
    printer->Indent();
    printer->Print("None = 0,\n");
    for (int j = 0; j < descriptor_->oneof_decl(i)->field_count(); j++) {
      const FieldDescriptor* field = descriptor_->oneof_decl(i)->field(j);
      printer->Print("$field_property_name$ = $index$,\n",
                     "field_property_name", GetPropertyName(field),
                     "index", SimpleItoa(field->number()));
    }
    printer->Outdent();
    printer->Print("}\n");
    // TODO: Should we put the oneof .proto comments here?
    // It's unclear exactly where they should go.
	printer->Print(
	  vars,
	  "private $property_name$OneofCase $name$Case_ = $property_name$OneofCase.None;\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	  vars,
	  "public $property_name$OneofCase $property_name$Case {\n"
	  "  get { return $name$Case_; }\n"
	  "}\n\n");
	WriteGeneratedCodeAttributes(printer);
	printer->Print(
	  vars,
      "public void Clear$property_name$() {\n"
      "  $name$Case_ = $property_name$OneofCase.None;\n"
      "  $name$_ = null;\n"
      "}\n\n");
  }

  // Standard methods
  GenerateFrameworkMethods(printer);
  GenerateMessageSerializationMethods(printer);
  GenerateMergingMethods(printer);

  // Nested messages and enums
  if (HasNestedGeneratedTypes()) {
    printer->Print(
      vars,
      "#region Nested types\n"
      "/// <summary>Container for nested types declared in the $class_name$ message type.</summary>\n");
    WriteGeneratedCodeAttributes(printer);
    printer->Print("public static partial class Types {\n");
    printer->Indent();
    for (int i = 0; i < descriptor_->enum_type_count(); i++) {
      EnumGenerator enumGenerator(descriptor_->enum_type(i), this->options());
      enumGenerator.Generate(printer);
    }
    for (int i = 0; i < descriptor_->nested_type_count(); i++) {
      // Don't generate nested types for maps...
      if (!IsMapEntryMessage(descriptor_->nested_type(i))) {
        MessageGenerator messageGenerator(
            descriptor_->nested_type(i), this->options());
        messageGenerator.Generate(printer);
      }
    }
    printer->Outdent();
    printer->Print("}\n"
                   "#endregion\n"
                   "\n");
  }

  printer->Outdent();
  printer->Print("}\n");
  printer->Print("\n");
}